

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knowledge_dynamics.cc
# Opt level: O0

void __thiscall
explode::knowledge_dynamics::knowledge_dynamics(knowledge_dynamics *this,input_exe_file *inp)

{
  ushort uVar1;
  int iVar2;
  input *piVar3;
  uint16_t *puVar4;
  header_t local_b4;
  int i;
  offset_type extra_data_start2;
  offset_type exe_data_start2;
  undefined1 local_90 [8];
  input_exe_file inner;
  inmem_input mio;
  uchar mzHeader2 [37];
  offset_type extra_data_start;
  input_exe_file *inp_local;
  knowledge_dynamics *this_local;
  
  piVar3 = input_exe_file::file(inp);
  this->m_file = piVar3;
  puVar4 = exe_file::operator[](&inp->super_exe_file,NUM_OF_PAGES);
  register0x00000000 = (ulong)*puVar4 * 0x200;
  puVar4 = exe_file::operator[](&inp->super_exe_file,NUM_OF_BYTES_IN_LAST_PAGE);
  if (*puVar4 != 0) {
    puVar4 = exe_file::operator[](&inp->super_exe_file,NUM_OF_BYTES_IN_LAST_PAGE);
    register0x00000000 = register0x00000000 - (int)(0x200 - (uint)*puVar4);
  }
  (*this->m_file->_vptr_input[5])(this->m_file,stack0xffffffffffffffe0);
  (*this->m_file->_vptr_input[2])();
  inmem_input::inmem_input((inmem_input *)&inner.m_file,(uchar *)&mio.m_ptr,0x25);
  input_exe_file::input_exe_file((input_exe_file *)local_90,(input *)&inner.m_file);
  puVar4 = exe_file::operator[]((exe_file *)local_90,HEADER_SIZE_PARA);
  uVar1 = *puVar4;
  puVar4 = exe_file::operator[]((exe_file *)local_90,NUM_OF_PAGES);
  iVar2 = (uint)*puVar4 * 0x200;
  puVar4 = exe_file::operator[]((exe_file *)local_90,NUM_OF_BYTES_IN_LAST_PAGE);
  if (*puVar4 != 0) {
    puVar4 = exe_file::operator[]((exe_file *)local_90,NUM_OF_BYTES_IN_LAST_PAGE);
    iVar2 = iVar2 - (0x200 - (uint)*puVar4);
  }
  this->m_expected_size = iVar2 + (uint)uVar1 * -0x10;
  this->m_code_offs = (int)stack0xffffffffffffffe0 + (uint)uVar1 * 0x10;
  for (local_b4 = SIGNATURE; (int)local_b4 < 0xe; local_b4 = local_b4 + NUM_OF_BYTES_IN_LAST_PAGE) {
    puVar4 = exe_file::operator[]((exe_file *)local_90,local_b4);
    this->m_header[(int)local_b4] = *puVar4;
  }
  inmem_input::~inmem_input((inmem_input *)&inner.m_file);
  return;
}

Assistant:

knowledge_dynamics::knowledge_dynamics(input_exe_file& inp)
    : m_file(inp.file())
  {
    offset_type extra_data_start = inp [exe_file::NUM_OF_PAGES] * 512L;
    if (inp[exe_file::NUM_OF_BYTES_IN_LAST_PAGE])
      {
	extra_data_start = static_cast <offset_type> (extra_data_start - (512 - inp[exe_file::NUM_OF_BYTES_IN_LAST_PAGE]));
      }
    unsigned char mzHeader2[0x25];
    m_file.seek(extra_data_start);
    m_file.read_buff(reinterpret_cast<char*>(mzHeader2), 0x25);

    explode::inmem_input mio(mzHeader2, 0x25);
    input_exe_file inner (mio);
    offset_type exe_data_start2 = inner[exe_file::HEADER_SIZE_PARA] * 16L; 
    offset_type extra_data_start2 = inner[exe_file::NUM_OF_PAGES] * 512L;
    if (inner[exe_file::NUM_OF_BYTES_IN_LAST_PAGE])
      {
	extra_data_start2 = static_cast <offset_type> (extra_data_start2 - (512 - inner[exe_file::NUM_OF_BYTES_IN_LAST_PAGE]));
      }
    m_expected_size = static_cast <uint32_t>  (extra_data_start2 - exe_data_start2);
    m_code_offs = static_cast <uint32_t>(extra_data_start + exe_data_start2);
    for (int i = 0; i < exe_file::MAX_HEADER_VAL; i++)
      {
	m_header[i] = inner[static_cast <exe_file::header_t> (i)];
      }
  }